

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::parse_hex::test_method(parse_hex *this)

{
  pointer left_begin;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  shared_count sVar4;
  shared_count sVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  string_view hex_str;
  const_string file_03;
  string_view str;
  const_string file_04;
  string_view hex_str_00;
  const_string file_05;
  string_view str_00;
  const_string file_06;
  string_view hex_str_01;
  const_string file_07;
  string_view str_01;
  const_string file_08;
  string_view hex_str_02;
  const_string file_09;
  string_view str_02;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  string_view hex_str_03;
  const_string file_16;
  string_view str_03;
  const_string file_17;
  const_string file_18;
  string_view hex_str_04;
  const_string file_19;
  string_view str_04;
  const_string file_20;
  string_view hex_str_05;
  const_string file_21;
  string_view str_05;
  const_string file_22;
  string_view hex_str_06;
  const_string file_23;
  string_view str_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  check_type cVar8;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  undefined4 local_524;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_520;
  undefined8 local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  vector<std::byte,_std::allocator<std::byte>_> hex_literal_vector;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  undefined1 local_180 [8];
  undefined1 local_178 [16];
  shared_count local_168;
  assertion_result *local_160;
  assertion_result local_158;
  shared_count local_140;
  element_type *local_138;
  shared_count sStack_130;
  undefined1 local_128 [16];
  shared_count sStack_118;
  char *local_110;
  undefined1 local_108 [16];
  shared_count local_f8;
  undefined8 **local_f0;
  string with_embedded_null;
  array<unsigned_char,_65UL> hex_literal_array_uint8;
  uchar local_7f [6];
  array<std::byte,_65UL> hex_literal_array;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,HEX_PARSE_OUTPUT,
             &DAT_00f52c01,(allocator_type *)&hex_literal_array);
  memcpy(&hex_literal_array,&DAT_00f52c01,0x41);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x9f;
  file.m_begin = (iterator)&local_1a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b8,msg);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_108,(equal_coll_impl *)local_178,hex_literal_array._M_elems,
             (uchar *)&local_38,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  hex_literal_array_uint8._M_elems[8] = '\0';
  hex_literal_array_uint8._M_elems._0_8_ = &PTR__lazy_ostream_01388f08;
  hex_literal_array_uint8._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hex_literal_array_uint8._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&hex_literal_array_uint8,1,0xd,4,0xf4a5a7
             ,(size_t)&local_1c8,0x9f,"hex_literal_span.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_f8);
  std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
            ((vector<std::byte,std::allocator<std::byte>> *)&hex_literal_vector,
             util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,
             (byte *)"N5boost9unit_test17lazy_ostream_implINS0_12lazy_ostreamEA134_cRA134_KcEE",
             (allocator_type *)&hex_literal_array_uint8);
  left_begin = hex_literal_vector.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xa3;
  file_00.m_begin = (iterator)&local_1f0;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_200,
             msg_00);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_108,(equal_coll_impl *)local_178,left_begin,
             hex_literal_vector.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  hex_literal_array_uint8._M_elems[8] = '\0';
  hex_literal_array_uint8._M_elems._0_8_ = &PTR__lazy_ostream_01388f08;
  hex_literal_array_uint8._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  hex_literal_array_uint8._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_208 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)&hex_literal_array_uint8,1,0xd,4,0xf4a5a7
             ,(size_t)&local_210,0xa3,"hex_literal_span.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_f8);
  memcpy(&hex_literal_array_uint8,&DAT_00f52c42,0x41);
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xa6;
  file_01.m_begin = (iterator)&local_220;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_230,
             msg_01);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
             hex_literal_array_uint8._M_elems,local_7f,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_01388f08;
  local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined8 **)0xf4aea1;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_238 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xf4a5d7,
             (size_t)&local_240,0xa6,"hex_literal_array_uint8.end()","expected.begin()",
             "expected.end()");
  boost::detail::shared_count::~shared_count(&local_168);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_108,
             util::hex_literals::detail::Hex<131ul>{std::array<std::byte_65ul>,
             (uchar *)"N5boost9unit_test17lazy_ostream_implINS0_12lazy_ostreamEA134_cRA134_KcEE",
             (allocator_type *)local_178);
  sVar4.pi_ = local_f8.pi_;
  uVar2 = local_108._8_8_;
  uVar1 = local_108._0_8_;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xa9;
  file_02.m_begin = (iterator)&local_250;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_260,
             msg_02);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )uVar1,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )uVar2,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_01388f08;
  local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined8 **)0xf4aea1;
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_268 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
             (size_t)&local_270,0xa9,"result.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_168);
  hex_str._M_str = HEX_PARSE_INPUT;
  hex_str._M_len = 0x82;
  ParseHex<unsigned_char>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,hex_str);
  sVar5.pi_ = local_f8.pi_;
  uVar3 = local_108._8_8_;
  uVar2 = local_108._0_8_;
  local_108._0_8_ = (_func_int **)0x0;
  local_108._8_8_ = (element_type *)0x0;
  local_f8.pi_ = (sp_counted_base *)0x0;
  if ((pointer)uVar1 != (pointer)0x0) {
    operator_delete((void *)uVar1,(long)sVar4.pi_ - uVar1);
    if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
    }
  }
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xac;
  file_03.m_begin = (iterator)&local_280;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_290,
             msg_03);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )uVar2,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )uVar3,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_01388f08;
  local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_f0 = (undefined8 **)0xf4aea1;
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_298 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
             (size_t)&local_2a0,0xac,"result.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_168);
  str._M_str = HEX_PARSE_INPUT;
  str._M_len = 0x82;
  TryParseHex<unsigned_char>
            ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)local_108,str)
  ;
  sVar4.pi_ = local_f8.pi_;
  uVar3 = local_108._8_8_;
  uVar1 = local_108._0_8_;
  if ((bool)(byte)local_f0 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (element_type *)0x0;
    local_f8.pi_ = (sp_counted_base *)0x0;
    if ((pointer)uVar2 != (pointer)0x0) {
      operator_delete((void *)uVar2,(long)sVar5.pi_ - uVar2);
    }
    if (((byte)local_f0 & 1) != 0) {
      local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
      }
    }
    local_2b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_2a8 = "";
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xaf;
    file_04.m_begin = (iterator)&local_2b0;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2c0,
               msg_04);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )uVar1,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )uVar3,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_f0 = (undefined8 **)0xf4aea1;
    local_2d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_2c8 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0xd;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
               (size_t)&local_2d0,0xaf,"result.end()","expected.begin()","expected.end()");
    boost::detail::shared_count::~shared_count(&local_168);
    local_108._0_4_ = 0x78563412;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,local_108);
    hex_str_00._M_str = "12 34 56 78";
    hex_str_00._M_len = 0xb;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,hex_str_00);
    sVar5.pi_ = local_f8.pi_;
    uVar3 = local_108._8_8_;
    uVar2 = local_108._0_8_;
    local_108._0_8_ = (_func_int **)0x0;
    local_108._8_8_ = (element_type *)0x0;
    local_f8.pi_ = (sp_counted_base *)0x0;
    if ((pointer)uVar1 != (pointer)0x0) {
      operator_delete((void *)uVar1,(long)sVar4.pi_ - uVar1);
      if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
      }
    }
    local_2e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_2d8 = "";
    local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0xb4;
    file_05.m_begin = (iterator)&local_2e0;
    msg_05.m_end = pvVar7;
    msg_05.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2f0,
               msg_05);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )uVar2,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )uVar3,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
    local_108._0_8_ = &PTR__lazy_ostream_01388f08;
    local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_f0 = (undefined8 **)0xf4aea1;
    local_300 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    local_2f8 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0xd;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
               (size_t)&local_300,0xb4,"result.end()","expected.begin()","expected.end()");
    boost::detail::shared_count::~shared_count(&local_168);
    str_00._M_str = "12 34 56 78";
    str_00._M_len = 0xb;
    TryParseHex<unsigned_char>
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)local_108,
               str_00);
    sVar4.pi_ = local_f8.pi_;
    uVar3 = local_108._8_8_;
    uVar1 = local_108._0_8_;
    if ((bool)(byte)local_f0 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      local_108._0_8_ = (_func_int **)0x0;
      local_108._8_8_ = (element_type *)0x0;
      local_f8.pi_ = (sp_counted_base *)0x0;
      if ((pointer)uVar2 != (pointer)0x0) {
        operator_delete((void *)uVar2,(long)sVar5.pi_ - uVar2);
      }
      if (((byte)local_f0 & 1) != 0) {
        local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
        if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
        }
      }
      local_310 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_308 = "";
      local_320 = &boost::unit_test::basic_cstring<char_const>::null;
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0xb6;
      file_06.m_begin = (iterator)&local_310;
      msg_06.m_end = pvVar7;
      msg_06.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_320,
                 msg_06);
      boost::test_tools::tt_detail::equal_coll_impl::operator()
                ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )uVar1,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )uVar3,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
      local_108._0_8_ = &PTR__lazy_ostream_01388f08;
      local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_f0 = (undefined8 **)0xf4aea1;
      local_330 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_328 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0xd;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
                 (size_t)&local_330,0xb6,"result.end()","expected.begin()","expected.end()");
      boost::detail::shared_count::~shared_count(&local_168);
      local_108._0_4_ = 0x78563489;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,local_108);
      hex_str_01._M_str = " 89 34 56 78";
      hex_str_01._M_len = 0xc;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,hex_str_01);
      sVar5.pi_ = local_f8.pi_;
      uVar3 = local_108._8_8_;
      uVar2 = local_108._0_8_;
      local_108._0_8_ = (_func_int **)0x0;
      local_108._8_8_ = (element_type *)0x0;
      local_f8.pi_ = (sp_counted_base *)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1,(long)sVar4.pi_ - uVar1);
        if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
        }
      }
      local_340 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_338 = "";
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0xbb;
      file_07.m_begin = (iterator)&local_340;
      msg_07.m_end = pvVar7;
      msg_07.m_begin = pvVar6;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_350,
                 msg_07);
      boost::test_tools::tt_detail::equal_coll_impl::operator()
                ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )uVar2,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )uVar3,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
      local_108._0_8_ = &PTR__lazy_ostream_01388f08;
      local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_f0 = (undefined8 **)0xf4aea1;
      local_360 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_358 = "";
      pvVar6 = (iterator)0x1;
      pvVar7 = (iterator)0xd;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
                 (size_t)&local_360,0xbb,"result.end()","expected.begin()","expected.end()");
      boost::detail::shared_count::~shared_count(&local_168);
      str_01._M_str = " 89 34 56 78";
      str_01._M_len = 0xc;
      TryParseHex<unsigned_char>
                ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)local_108,
                 str_01);
      sVar4.pi_ = local_f8.pi_;
      uVar3 = local_108._8_8_;
      uVar1 = local_108._0_8_;
      if ((bool)(byte)local_f0 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        local_108._0_8_ = (_func_int **)0x0;
        local_108._8_8_ = (element_type *)0x0;
        local_f8.pi_ = (sp_counted_base *)0x0;
        if ((pointer)uVar2 != (pointer)0x0) {
          operator_delete((void *)uVar2,(long)sVar5.pi_ - uVar2);
        }
        if (((byte)local_f0 & 1) != 0) {
          local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
          if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
          }
        }
        local_370 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_368 = "";
        local_380 = &boost::unit_test::basic_cstring<char_const>::null;
        local_378 = &boost::unit_test::basic_cstring<char_const>::null;
        file_08.m_end = (iterator)0xbd;
        file_08.m_begin = (iterator)&local_370;
        msg_08.m_end = pvVar7;
        msg_08.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_380
                   ,msg_08);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )uVar1,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )uVar3,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
        local_108._0_8_ = &PTR__lazy_ostream_01388f08;
        local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_f0 = (undefined8 **)0xf4aea1;
        local_390 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_388 = "";
        pvVar6 = (iterator)0x1;
        pvVar7 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
                   (size_t)&local_390,0xbd,"result.end()","expected.begin()","expected.end()");
        boost::detail::shared_count::~shared_count(&local_168);
        local_108._0_2_ = 0xaaff;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_assign_aux<unsigned_char_const*>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&expected,local_108);
        hex_str_02._M_str = "     Ff        aA    ";
        hex_str_02._M_len = 0x15;
        ParseHex<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_108,hex_str_02);
        sVar5.pi_ = local_f8.pi_;
        uVar3 = local_108._8_8_;
        uVar2 = local_108._0_8_;
        local_108._0_8_ = (_func_int **)0x0;
        local_108._8_8_ = (element_type *)0x0;
        local_f8.pi_ = (sp_counted_base *)0x0;
        if ((pointer)uVar1 != (pointer)0x0) {
          operator_delete((void *)uVar1,(long)sVar4.pi_ - uVar1);
          if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
            operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
          }
        }
        local_3a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_398 = "";
        local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0xc2;
        file_09.m_begin = (iterator)&local_3a0;
        msg_09.m_end = pvVar7;
        msg_09.m_begin = pvVar6;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3b0
                   ,msg_09);
        boost::test_tools::tt_detail::equal_coll_impl::operator()
                  ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )uVar2,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )uVar3,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
        local_108._0_8_ = &PTR__lazy_ostream_01388f08;
        local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_f0 = (undefined8 **)0xf4aea1;
        local_3c0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
        ;
        local_3b8 = "";
        pvVar6 = (iterator)0x1;
        pvVar7 = (iterator)0xd;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
                   (size_t)&local_3c0,0xc2,"result.end()","expected.begin()","expected.end()");
        boost::detail::shared_count::~shared_count(&local_168);
        str_02._M_str = "     Ff        aA    ";
        str_02._M_len = 0x15;
        TryParseHex<unsigned_char>
                  ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   local_108,str_02);
        sVar4.pi_ = local_f8.pi_;
        uVar3 = local_108._8_8_;
        uVar1 = local_108._0_8_;
        if ((bool)(byte)local_f0 == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          local_108._0_8_ = (_func_int **)0x0;
          local_108._8_8_ = (element_type *)0x0;
          local_f8.pi_ = (sp_counted_base *)0x0;
          if ((pointer)uVar2 != (pointer)0x0) {
            operator_delete((void *)uVar2,(long)sVar5.pi_ - uVar2);
          }
          if (((byte)local_f0 & 1) != 0) {
            local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
            if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
              operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
            }
          }
          local_3d0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_3c8 = "";
          local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_10.m_end = (iterator)0xc4;
          file_10.m_begin = (iterator)&local_3d0;
          msg_10.m_end = pvVar7;
          msg_10.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,
                     (size_t)&local_3e0,msg_10);
          boost::test_tools::tt_detail::equal_coll_impl::operator()
                    ((assertion_result *)local_178,(equal_coll_impl *)&with_embedded_null,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )uVar1,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              )uVar3,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
          local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
          local_108._0_8_ = &PTR__lazy_ostream_01388f08;
          local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_f0 = (undefined8 **)0xf4aea1;
          local_3f0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_3e8 = "";
          pvVar6 = (iterator)0x1;
          pvVar7 = (iterator)0xd;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_178,(lazy_ostream *)local_108,1,0xd,4,0xe39fe8,
                     (size_t)&local_3f0,0xc4,"result.end()","expected.begin()","expected.end()");
          boost::detail::shared_count::~shared_count(&local_168);
          local_400 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_3f8 = "";
          local_410 = &boost::unit_test::basic_cstring<char_const>::null;
          local_408 = &boost::unit_test::basic_cstring<char_const>::null;
          file_11.m_end = (iterator)0xc9;
          file_11.m_begin = (iterator)&local_400;
          msg_11.m_end = pvVar7;
          msg_11.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
                     (size_t)&local_410,msg_11);
          with_embedded_null._M_string_length =
               with_embedded_null._M_string_length & 0xffffffffffffff00;
          with_embedded_null._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
          with_embedded_null.field_2._M_allocated_capacity._0_7_ = 0x139d138;
          with_embedded_null.field_2._7_4_ = 0xf4aea100;
          with_embedded_null.field_2._M_local_buf[0xb] = '\0';
          with_embedded_null.field_2._12_4_ = 0;
          std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte_const*,void>
                    ((vector<std::byte,std::allocator<std::byte>> *)&local_140,(byte *)0x0,
                     (byte *)0x0,(allocator_type *)local_108);
          local_180 = (undefined1  [8])((long)local_138 - (long)local_140.pi_);
          local_158.m_message.px = (element_type *)local_180;
          local_158._0_8_ = &local_508;
          local_508 = (ulong)local_508._4_4_ << 0x20;
          local_128[0] = local_180 == (undefined1  [8])0x0;
          local_128._8_8_ = (element_type *)0x0;
          sStack_118.pi_ = (sp_counted_base *)0x0;
          local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "";
          local_f0 = (undefined8 **)&local_158.m_message;
          local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
          local_108._0_8_ = &PTR__lazy_ostream_01388f48;
          local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_160 = &local_158;
          local_178[8] = false;
          local_178._0_8_ = &PTR__lazy_ostream_013890c8;
          local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          pvVar6 = (iterator)0x1;
          pvVar7 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_128,(lazy_ostream *)&with_embedded_null,1,2,REQUIRE,
                     0xf4a644,(size_t)&local_520,0xc9,(allocator_type *)local_108,"0",
                     (assertion_result *)local_178);
          boost::detail::shared_count::~shared_count(&sStack_118);
          if (local_140.pi_ != (sp_counted_base *)0x0) {
            operator_delete(local_140.pi_,(long)sStack_130.pi_ - (long)local_140.pi_);
          }
          local_420 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_418 = "";
          local_430 = &boost::unit_test::basic_cstring<char_const>::null;
          local_428 = &boost::unit_test::basic_cstring<char_const>::null;
          file_12.m_end = (iterator)0xca;
          file_12.m_begin = (iterator)&local_420;
          msg_12.m_end = pvVar7;
          msg_12.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,
                     (size_t)&local_430,msg_12);
          with_embedded_null._M_string_length =
               with_embedded_null._M_string_length & 0xffffffffffffff00;
          with_embedded_null._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
          with_embedded_null.field_2._M_allocated_capacity._0_7_ = 0x139d138;
          with_embedded_null.field_2._7_4_ = 0xf4aea100;
          with_embedded_null.field_2._M_local_buf[0xb] = '\0';
          with_embedded_null.field_2._12_4_ = 0;
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<unsigned_char_const*,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_140,(uchar *)0x0,
                     (uchar *)0x0,(allocator_type *)local_108);
          local_180 = (undefined1  [8])((long)local_138 - (long)local_140.pi_);
          local_508 = local_508 & 0xffffffff00000000;
          local_128[0] = local_180 == (undefined1  [8])0x0;
          local_128._8_8_ = (element_type *)0x0;
          sStack_118.pi_ = (sp_counted_base *)0x0;
          local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "";
          local_158.m_message.px = (element_type *)local_180;
          local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
          local_108._0_8_ = &PTR__lazy_ostream_01388f48;
          local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_f0 = (undefined8 **)&local_158.m_message;
          local_158._0_8_ = &local_508;
          local_178[8] = false;
          local_178._0_8_ = &PTR__lazy_ostream_013890c8;
          local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_160 = &local_158;
          pvVar6 = (iterator)0x1;
          pvVar7 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_128,(lazy_ostream *)&with_embedded_null,1,2,REQUIRE,
                     0xf4a654,(size_t)&local_520,0xca,(allocator_type *)local_108,"0",
                     (assertion_result *)local_178);
          boost::detail::shared_count::~shared_count(&sStack_118);
          if (local_140.pi_ != (sp_counted_base *)0x0) {
            operator_delete(local_140.pi_,(long)sStack_130.pi_ - (long)local_140.pi_);
          }
          local_440 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_438 = "";
          local_450 = &boost::unit_test::basic_cstring<char_const>::null;
          local_448 = &boost::unit_test::basic_cstring<char_const>::null;
          file_13.m_end = (iterator)0xcb;
          file_13.m_begin = (iterator)&local_440;
          msg_13.m_end = pvVar7;
          msg_13.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,
                     (size_t)&local_450,msg_13);
          with_embedded_null._M_string_length =
               with_embedded_null._M_string_length & 0xffffffffffffff00;
          with_embedded_null._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
          with_embedded_null.field_2._M_allocated_capacity._0_7_ = 0x139d138;
          with_embedded_null.field_2._7_4_ = 0xf4aea100;
          with_embedded_null.field_2._M_local_buf[0xb] = '\0';
          with_embedded_null.field_2._12_4_ = 0;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,
                     (string_view)(ZEXT816(0xf4aea1) << 0x40));
          local_180 = (undefined1  [8])((long)local_138 - (long)local_140.pi_);
          local_508 = local_508 & 0xffffffff00000000;
          local_128[0] = local_180 == (undefined1  [8])0x0;
          local_128._8_8_ = (element_type *)0x0;
          sStack_118.pi_ = (sp_counted_base *)0x0;
          local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = "";
          local_158.m_message.px = (element_type *)local_180;
          local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
          local_108._0_8_ = &PTR__lazy_ostream_01388f48;
          local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_f0 = (undefined8 **)&local_158.m_message;
          local_158._0_8_ = &local_508;
          local_178[8] = false;
          local_178._0_8_ = &PTR__lazy_ostream_013890c8;
          local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          local_160 = &local_158;
          pvVar6 = (iterator)0x1;
          pvVar7 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_128,(lazy_ostream *)&with_embedded_null,1,2,REQUIRE,
                     0xf4a667,(size_t)&local_520,0xcb,(allocator_type *)local_108,"0",
                     (assertion_result *)local_178);
          boost::detail::shared_count::~shared_count(&sStack_118);
          if (local_140.pi_ != (sp_counted_base *)0x0) {
            operator_delete(local_140.pi_,(long)sStack_130.pi_ - (long)local_140.pi_);
          }
          local_460 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
          ;
          local_458 = "";
          local_470 = &boost::unit_test::basic_cstring<char_const>::null;
          local_468 = &boost::unit_test::basic_cstring<char_const>::null;
          file_14.m_end = (iterator)0xcc;
          file_14.m_begin = (iterator)&local_460;
          msg_14.m_end = pvVar7;
          msg_14.m_begin = pvVar6;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_470,msg_14);
          with_embedded_null._M_string_length =
               with_embedded_null._M_string_length & 0xffffffffffffff00;
          with_embedded_null._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
          with_embedded_null.field_2._M_allocated_capacity._0_7_ = 0x139d138;
          with_embedded_null.field_2._7_4_ = 0xf4aea100;
          with_embedded_null.field_2._M_local_buf[0xb] = '\0';
          with_embedded_null.field_2._12_4_ = 0;
          TryParseHex<unsigned_char>
                    ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                     local_128,(string_view)(ZEXT816(0xf4aea1) << 0x40));
          if (local_110._0_1_ == false) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            local_180 = (undefined1  [8])(local_128._8_8_ + -local_128._0_8_);
            local_508 = local_508 & 0xffffffff00000000;
            local_140.pi_._0_1_ =
                 (class_property<bool>)(class_property<bool>)(local_180 == (undefined1  [8])0x0);
            local_138 = (element_type *)0x0;
            sStack_130.pi_ = (sp_counted_base *)0x0;
            local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = "";
            local_158.m_message.px = (element_type *)local_180;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
            local_108._0_8_ = &PTR__lazy_ostream_01388f48;
            local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_f0 = (undefined8 **)&local_158.m_message;
            local_158._0_8_ = &local_508;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_013890c8;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_160 = &local_158;
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_140,(lazy_ostream *)&with_embedded_null,1,2,
                       REQUIRE,0xf4a67b,(size_t)&local_520,0xcc,(allocator_type *)local_108,"0",
                       (assertion_result *)local_178);
            boost::detail::shared_count::~shared_count(&sStack_130);
            if (local_110._0_1_ == true) {
              local_110 = (char *)((ulong)local_110 & 0xffffffffffffff00);
              if ((pointer)local_128._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_128._0_8_,(long)sStack_118.pi_ - local_128._0_8_);
              }
            }
            local_480 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_478 = "";
            local_490 = &boost::unit_test::basic_cstring<char_const>::null;
            local_488 = &boost::unit_test::basic_cstring<char_const>::null;
            file_15.m_end = (iterator)0xcf;
            file_15.m_begin = (iterator)&local_480;
            msg_15.m_end = pvVar7;
            msg_15.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                       (size_t)&local_490,msg_15);
            with_embedded_null._M_string_length =
                 with_embedded_null._M_string_length & 0xffffffffffffff00;
            with_embedded_null._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388f08;
            with_embedded_null.field_2._M_allocated_capacity._0_7_ = 0x139d138;
            with_embedded_null.field_2._7_4_ = 0xf4aea100;
            with_embedded_null.field_2._M_local_buf[0xb] = '\0';
            with_embedded_null.field_2._12_4_ = 0;
            hex_str_03._M_str = "AAF F";
            hex_str_03._M_len = 5;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_140,
                       hex_str_03);
            local_180 = (undefined1  [8])((long)local_138 - (long)local_140.pi_);
            local_508 = local_508 & 0xffffffff00000000;
            local_128[0] = local_180 == (undefined1  [8])0x0;
            local_128._8_8_ = (element_type *)0x0;
            sStack_118.pi_ = (sp_counted_base *)0x0;
            local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = "";
            local_158.m_message.px = (element_type *)local_180;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
            local_108._0_8_ = &PTR__lazy_ostream_01388f48;
            local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_f0 = (undefined8 **)&local_158.m_message;
            local_158._0_8_ = &local_508;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_013890c8;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_160 = &local_158;
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x2;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_128,(lazy_ostream *)&with_embedded_null,1,2,REQUIRE
                       ,0xf4a6a9,(size_t)&local_520,0xcf,(allocator_type *)local_108,"0",
                       (assertion_result *)local_178);
            boost::detail::shared_count::~shared_count(&sStack_118);
            if (local_140.pi_ != (sp_counted_base *)0x0) {
              operator_delete(local_140.pi_,(long)sStack_130.pi_ - (long)local_140.pi_);
            }
            local_4a0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_498 = "";
            local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_16.m_end = (iterator)0xd0;
            file_16.m_begin = (iterator)&local_4a0;
            msg_16.m_end = pvVar7;
            msg_16.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                       (size_t)&local_4b0,msg_16);
            _cVar8 = 0x6e23dc;
            str_03._M_str = "AAF F";
            str_03._M_len = 5;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       str_03);
            with_embedded_null._M_dataplus._M_p =
                 (pointer)(CONCAT71(with_embedded_null._M_dataplus._M_p._1_7_,(byte)local_f0) ^ 1);
            with_embedded_null._M_string_length = 0;
            with_embedded_null.field_2._M_allocated_capacity._0_7_ = 0;
            with_embedded_null.field_2._7_4_ = with_embedded_null.field_2._7_4_ & 0xffffff00;
            local_128._0_8_ = "!TryParseHex(\"AAF F\").has_value()";
            local_128._8_8_ = "";
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_01389048;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_4c0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_4b8 = "";
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x0;
            local_160 = (assertion_result *)local_128;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&with_embedded_null,(lazy_ostream *)local_178,1,0,WARN,
                       _cVar8,(size_t)&local_4c0,0xd0);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&with_embedded_null.field_2._M_allocated_capacity);
            if ((bool)(byte)local_f0 == true) {
              local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
              if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
                operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
              }
            }
            with_embedded_null._M_dataplus._M_p = (pointer)&with_embedded_null.field_2;
            with_embedded_null.field_2._M_allocated_capacity._0_7_ = 0x20002020313120;
            with_embedded_null.field_2._7_4_ = 0x20323220;
            with_embedded_null._M_string_length = 0xb;
            with_embedded_null.field_2._M_local_buf[0xb] = '\0';
            local_4d0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_4c8 = "";
            local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_17.m_end = (iterator)0xd6;
            file_17.m_begin = (iterator)&local_4d0;
            msg_17.m_end = pvVar7;
            msg_17.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                       (size_t)&local_4e0,msg_17);
            local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
            local_128._0_8_ = &PTR__lazy_ostream_01388f08;
            sStack_118.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_110 = "";
            local_180 = (undefined1  [8])with_embedded_null._M_string_length;
            local_508 = CONCAT44(local_508._4_4_,0xb);
            local_138 = (element_type *)0x0;
            sStack_130.pi_ = (sp_counted_base *)0x0;
            local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = "";
            local_158.m_message.px = (element_type *)local_180;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
            local_108._0_8_ = &PTR__lazy_ostream_01388f48;
            local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_f0 = (undefined8 **)&local_158.m_message;
            local_158._0_8_ = &local_508;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_013890c8;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_160 = &local_158;
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x2;
            local_140.pi_._0_1_ =
                 (class_property<bool>)
                 (class_property<bool>)(with_embedded_null._M_string_length == 0xb);
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_140,(lazy_ostream *)local_128,1,2,REQUIRE,0xf4a6e4
                       ,(size_t)&local_520,0xd6,
                       (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       "11",(lazy_ostream *)local_178);
            boost::detail::shared_count::~shared_count(&sStack_130);
            local_4f0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_4e8 = "";
            local_500 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_18.m_end = (iterator)0xd7;
            file_18.m_begin = (iterator)&local_4f0;
            msg_18.m_end = pvVar7;
            msg_18.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                       (size_t)&local_500,msg_18);
            local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
            local_128._0_8_ = &PTR__lazy_ostream_01388f08;
            sStack_118.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_110 = "";
            hex_str_04._M_str = with_embedded_null._M_dataplus._M_p;
            hex_str_04._M_len = with_embedded_null._M_string_length;
            ParseHex<unsigned_char>(&local_520,hex_str_04);
            local_508 = (long)local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
            local_524 = 0;
            local_140.pi_._0_1_ = (class_property<bool>)(class_property<bool>)(local_508 == 0);
            local_138 = (element_type *)0x0;
            sStack_130.pi_ = (sp_counted_base *)0x0;
            local_158.m_message.px = (element_type *)0xf4a348;
            local_158.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
            local_158._0_8_ = &local_508;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
            local_108._0_8_ = &PTR__lazy_ostream_01388f48;
            local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_f0 = (undefined8 **)&local_158;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_013890c8;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_160 = (assertion_result *)local_180;
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x2;
            local_180 = (undefined1  [8])&local_524;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_140,(lazy_ostream *)local_128,1,2,REQUIRE,0xf4a6fe
                       ,(size_t)&local_158.m_message,0xd7,
                       (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       "0",(lazy_ostream *)local_178);
            boost::detail::shared_count::~shared_count(&sStack_130);
            if (local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_520.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_520.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_538 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_530 = "";
            local_548 = &boost::unit_test::basic_cstring<char_const>::null;
            local_540 = &boost::unit_test::basic_cstring<char_const>::null;
            file_19.m_end = (iterator)0xd8;
            file_19.m_begin = (iterator)&local_538;
            msg_19.m_end = pvVar7;
            msg_19.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                       (size_t)&local_548,msg_19);
            _cVar8 = 0x6e2881;
            str_04._M_str = with_embedded_null._M_dataplus._M_p;
            str_04._M_len = with_embedded_null._M_string_length;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       str_04);
            local_128._0_8_ = CONCAT71(local_128._1_7_,(byte)local_f0) ^ 1;
            local_128._8_8_ = (element_type *)0x0;
            sStack_118.pi_ = (sp_counted_base *)0x0;
            local_140.pi_ = (sp_counted_base *)0xf4a722;
            local_138 = (element_type *)0xf4a74e;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_01389048;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_558 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_550 = "";
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x0;
            local_160 = (assertion_result *)&local_140;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_128,(lazy_ostream *)local_178,1,0,WARN,_cVar8,
                       (size_t)&local_558,0xd8);
            boost::detail::shared_count::~shared_count(&sStack_118);
            if ((bool)(byte)local_f0 == true) {
              local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
              if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
                operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
              }
            }
            local_568 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_560 = "";
            local_578 = &boost::unit_test::basic_cstring<char_const>::null;
            local_570 = &boost::unit_test::basic_cstring<char_const>::null;
            file_20.m_end = (iterator)0xdb;
            file_20.m_begin = (iterator)&local_568;
            msg_20.m_end = pvVar7;
            msg_20.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                       (size_t)&local_578,msg_20);
            local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
            local_128._0_8_ = &PTR__lazy_ostream_01388f08;
            sStack_118.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_110 = "";
            hex_str_05._M_str = "1234 invalid 1234";
            hex_str_05._M_len = 0x11;
            ParseHex<unsigned_char>(&local_520,hex_str_05);
            local_508 = (long)local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
            local_524 = 0;
            local_140.pi_._0_1_ = (class_property<bool>)(class_property<bool>)(local_508 == 0);
            local_138 = (element_type *)0x0;
            sStack_130.pi_ = (sp_counted_base *)0x0;
            local_158.m_message.px = (element_type *)0xf4a348;
            local_158.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
            local_158._0_8_ = &local_508;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
            local_108._0_8_ = &PTR__lazy_ostream_01388f48;
            local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_f0 = (undefined8 **)&local_158;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_013890c8;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_160 = (assertion_result *)local_180;
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x2;
            local_180 = (undefined1  [8])&local_524;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_140,(lazy_ostream *)local_128,1,2,REQUIRE,0xf4a761
                       ,(size_t)&local_158.m_message,0xdb,
                       (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       "0",(lazy_ostream *)local_178);
            boost::detail::shared_count::~shared_count(&sStack_130);
            if (local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_520.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_520.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_588 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_580 = "";
            local_598 = &boost::unit_test::basic_cstring<char_const>::null;
            local_590 = &boost::unit_test::basic_cstring<char_const>::null;
            file_21.m_end = (iterator)0xdc;
            file_21.m_begin = (iterator)&local_588;
            msg_21.m_end = pvVar7;
            msg_21.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                       (size_t)&local_598,msg_21);
            _cVar8 = 0x6e2b72;
            str_05._M_str = "1234 invalid 1234";
            str_05._M_len = 0x11;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       str_05);
            local_128._0_8_ = CONCAT71(local_128._1_7_,(byte)local_f0) ^ 1;
            local_128._8_8_ = (element_type *)0x0;
            sStack_118.pi_ = (sp_counted_base *)0x0;
            local_140.pi_ = (sp_counted_base *)0xf4a786;
            local_138 = (element_type *)0xf4a7b3;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_01389048;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_5a8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5a0 = "";
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x0;
            local_160 = (assertion_result *)&local_140;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_128,(lazy_ostream *)local_178,1,0,WARN,_cVar8,
                       (size_t)&local_5a8,0xdc);
            boost::detail::shared_count::~shared_count(&sStack_118);
            if ((bool)(byte)local_f0 == true) {
              local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
              if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
                operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
              }
            }
            local_5b8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5b0 = "";
            local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_22.m_end = (iterator)0xdf;
            file_22.m_begin = (iterator)&local_5b8;
            msg_22.m_end = pvVar7;
            msg_22.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                       (size_t)&local_5c8,msg_22);
            local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
            local_128._0_8_ = &PTR__lazy_ostream_01388f08;
            sStack_118.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_110 = "";
            hex_str_06._M_str = "12 3";
            hex_str_06._M_len = 4;
            ParseHex<unsigned_char>(&local_520,hex_str_06);
            local_508 = (long)local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
            local_524 = 0;
            local_140.pi_._0_1_ = (class_property<bool>)(class_property<bool>)(local_508 == 0);
            local_138 = (element_type *)0x0;
            sStack_130.pi_ = (sp_counted_base *)0x0;
            local_158.m_message.px = (element_type *)0xf4a348;
            local_158.m_message.pn.pi_ = (sp_counted_base *)0xf4a3ab;
            local_158._0_8_ = &local_508;
            local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
            local_108._0_8_ = &PTR__lazy_ostream_01388f48;
            local_f8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_f0 = (undefined8 **)&local_158;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_013890c8;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_160 = (assertion_result *)local_180;
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x2;
            local_180 = (undefined1  [8])&local_524;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_140,(lazy_ostream *)local_128,1,2,REQUIRE,0xf4a7b9
                       ,(size_t)&local_158.m_message,0xdf,
                       (optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       "0",(lazy_ostream *)local_178);
            boost::detail::shared_count::~shared_count(&sStack_130);
            if (local_520.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_520.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_520.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_520.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_5d8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5d0 = "";
            local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_23.m_end = (iterator)0xe0;
            file_23.m_begin = (iterator)&local_5d8;
            msg_23.m_end = pvVar7;
            msg_23.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,
                       (size_t)&local_5e8,msg_23);
            _cVar8 = 0x6e2e54;
            str_06._M_str = "12 3";
            str_06._M_len = 4;
            TryParseHex<std::byte>
                      ((optional<std::vector<std::byte,_std::allocator<std::byte>_>_> *)local_108,
                       str_06);
            local_128._0_8_ = CONCAT71(local_128._1_7_,(byte)local_f0) ^ 1;
            local_128._8_8_ = (element_type *)0x0;
            sStack_118.pi_ = (sp_counted_base *)0x0;
            local_140.pi_ = (sp_counted_base *)0xf4a7d1;
            local_138 = (element_type *)0xf4a7f1;
            local_178[8] = false;
            local_178._0_8_ = &PTR__lazy_ostream_01389048;
            local_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            local_5f8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
            ;
            local_5f0 = "";
            local_160 = (assertion_result *)&local_140;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_128,(lazy_ostream *)local_178,1,0,WARN,_cVar8,
                       (size_t)&local_5f8,0xe0);
            boost::detail::shared_count::~shared_count(&sStack_118);
            if ((bool)(byte)local_f0 == true) {
              local_f0 = (undefined8 **)((ulong)local_f0 & 0xffffffffffffff00);
              if ((_func_int **)local_108._0_8_ != (_func_int **)0x0) {
                operator_delete((void *)local_108._0_8_,(long)local_f8.pi_ - local_108._0_8_);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)with_embedded_null._M_dataplus._M_p != &with_embedded_null.field_2) {
              operator_delete(with_embedded_null._M_dataplus._M_p,
                              CONCAT17(with_embedded_null.field_2._M_local_buf[7],
                                       with_embedded_null.field_2._M_allocated_capacity._0_7_) + 1);
            }
            if (hex_literal_vector.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                .super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(hex_literal_vector.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)hex_literal_vector.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)hex_literal_vector.
                                    super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(expected.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)expected.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)expected.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if ((pointer)uVar1 != (pointer)0x0) {
              operator_delete((void *)uVar1,(long)sVar4.pi_ - uVar1);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              return;
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(parse_hex)
{
    std::vector<unsigned char> result;

    // Basic test vector
    std::vector<unsigned char> expected(std::begin(HEX_PARSE_OUTPUT), std::end(HEX_PARSE_OUTPUT));
    constexpr std::array<std::byte, 65> hex_literal_array{operator""_hex<util::detail::Hex(HEX_PARSE_INPUT)>()};
    auto hex_literal_span{MakeUCharSpan(hex_literal_array)};
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_span.begin(), hex_literal_span.end(), expected.begin(), expected.end());

    const std::vector<std::byte> hex_literal_vector{operator""_hex_v<util::detail::Hex(HEX_PARSE_INPUT)>()};
    hex_literal_span = MakeUCharSpan(hex_literal_vector);
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_span.begin(), hex_literal_span.end(), expected.begin(), expected.end());

    constexpr std::array<uint8_t, 65> hex_literal_array_uint8{operator""_hex_u8<util::detail::Hex(HEX_PARSE_INPUT)>()};
    BOOST_CHECK_EQUAL_COLLECTIONS(hex_literal_array_uint8.begin(), hex_literal_array_uint8.end(), expected.begin(), expected.end());

    result = operator""_hex_v_u8<util::detail::Hex(HEX_PARSE_INPUT)>();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    result = ParseHex(HEX_PARSE_INPUT);
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    result = TryParseHex<uint8_t>(HEX_PARSE_INPUT).value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Spaces between bytes must be supported
    expected = {0x12, 0x34, 0x56, 0x78};
    result = ParseHex("12 34 56 78");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>("12 34 56 78").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Leading space must be supported (used in BerkeleyEnvironment::Salvage)
    expected = {0x89, 0x34, 0x56, 0x78};
    result = ParseHex(" 89 34 56 78");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>(" 89 34 56 78").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Mixed case and spaces are supported
    expected = {0xff, 0xaa};
    result = ParseHex("     Ff        aA    ");
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());
    result = TryParseHex<uint8_t>("     Ff        aA    ").value();
    BOOST_CHECK_EQUAL_COLLECTIONS(result.begin(), result.end(), expected.begin(), expected.end());

    // Empty string is supported
    static_assert(""_hex.empty());
    static_assert(""_hex_u8.empty());
    BOOST_CHECK_EQUAL(""_hex_v.size(), 0);
    BOOST_CHECK_EQUAL(""_hex_v_u8.size(), 0);
    BOOST_CHECK_EQUAL(ParseHex("").size(), 0);
    BOOST_CHECK_EQUAL(TryParseHex<uint8_t>("").value().size(), 0);

    // Spaces between nibbles is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("AAF F").size(), 0);
    BOOST_CHECK(!TryParseHex("AAF F").has_value());

    // Embedded null is treated as invalid
    const std::string with_embedded_null{" 11 "s
                                         " \0 "
                                         " 22 "s};
    BOOST_CHECK_EQUAL(with_embedded_null.size(), 11);
    BOOST_CHECK_EQUAL(ParseHex(with_embedded_null).size(), 0);
    BOOST_CHECK(!TryParseHex(with_embedded_null).has_value());

    // Non-hex is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("1234 invalid 1234").size(), 0);
    BOOST_CHECK(!TryParseHex("1234 invalid 1234").has_value());

    // Truncated input is treated as invalid
    BOOST_CHECK_EQUAL(ParseHex("12 3").size(), 0);
    BOOST_CHECK(!TryParseHex("12 3").has_value());
}